

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_usage_encoding_example.c
# Opt level: O0

int main(void)

{
  bech32_error error_code;
  size_t hrplen;
  bech32_bstring *bstring_00;
  char *pcVar1;
  bech32_error err;
  bech32_bstring *bstring;
  uchar dp [5];
  char hrp [6];
  
  stack0xfffffffffffffff4 = 0;
  stack0xffffffffffffffee = 0x6c6c6568;
  dp[1] = 'o';
  dp[2] = '\0';
  bstring._1_4_ = 0x1f030f0e;
  bstring._5_1_ = 0xd;
  hrplen = strlen((char *)((long)&bstring + 6));
  bstring_00 = bech32_create_bstring(hrplen,5);
  if (bstring_00 == (bech32_bstring *)0x0) {
    printf("bech32 string can not be created");
    stack0xfffffffffffffff4 = E_BECH32_NO_MEMORY;
  }
  else {
    error_code = bech32_encode(bstring_00,(char *)((long)&bstring + 6),(uchar *)((long)&bstring + 1)
                               ,5);
    if (error_code == E_BECH32_SUCCESS) {
      printf(
            "bech32 encoding of human-readable part \'hello\' and data part \'[14, 15, 3, 31, 13]\' is:\n"
            );
      printf("%s\n",bstring_00->string);
      bech32_free_bstring(bstring_00);
      stack0xfffffffffffffff4 = E_BECH32_SUCCESS;
    }
    else {
      pcVar1 = bech32_strerror(error_code);
      printf("%s\n",pcVar1);
      bech32_free_bstring(bstring_00);
      unique0x10000122 = error_code;
    }
  }
  return stack0xfffffffffffffff4;
}

Assistant:

int main(void) {
    // simple human readable part with some data
    char hrp[] = "hello";
    unsigned char dp[] = {14, 15, 3, 31, 13};

    // create storage for bech32 string
    bech32_bstring *bstring = bech32_create_bstring(strlen(hrp), sizeof(dp));
    if(!bstring) {
        printf("bech32 string can not be created");
        return E_BECH32_NO_MEMORY;
    }

    // encode
    bech32_error err = bech32_encode(bstring, hrp, dp, sizeof(dp));
    if(err != E_BECH32_SUCCESS) {
        printf("%s\n", bech32_strerror(err));
        bech32_free_bstring(bstring);
        return (int)err;
    }

    printf("bech32 encoding of human-readable part \'hello\' and data part \'[14, 15, 3, 31, 13]\' is:\n");
    printf("%s\n", bstring->string);
    // prints "hello1w0rldjn365x"
    // ... "hello" + Bech32.separator ("1") + encoded data ("w0rld") + 6 char checksum ("jn365x")

    // free memory
    bech32_free_bstring(bstring);

    return E_BECH32_SUCCESS;
}